

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_bitstream.c
# Opt level: O2

UWORD32 ihevcd_bits_get(bitstrm_t *ps_bitstrm,UWORD32 u4_numbits)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar2 = (ps_bitstrm->u4_cur_word << ((byte)ps_bitstrm->u4_bit_ofst & 0x1f)) >>
          (-(char)u4_numbits & 0x1fU);
  uVar3 = ps_bitstrm->u4_bit_ofst + u4_numbits;
  ps_bitstrm->u4_bit_ofst = uVar3;
  if (uVar3 < 0x21) {
    if (uVar3 != 0x20) {
      return uVar2;
    }
  }
  else {
    uVar4 = 0;
    if (0x40 - uVar3 < 0x20) {
      uVar4 = ps_bitstrm->u4_nxt_word >> ((byte)(0x40 - uVar3) & 0x1f);
    }
    uVar2 = uVar2 | uVar4;
  }
  ps_bitstrm->u4_cur_word = ps_bitstrm->u4_nxt_word;
  puVar1 = ps_bitstrm->pu4_buf;
  ps_bitstrm->pu4_buf = puVar1 + 1;
  uVar4 = *puVar1;
  ps_bitstrm->u4_bit_ofst = uVar3 - 0x20;
  ps_bitstrm->u4_nxt_word =
       uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
  return uVar2;
}

Assistant:

UWORD32 ihevcd_bits_get(bitstrm_t *ps_bitstrm, UWORD32 u4_numbits)
{
    UWORD32 u4_bits_read;

    BITS_GET(u4_bits_read,
             ps_bitstrm->pu4_buf,
             ps_bitstrm->u4_bit_ofst,
             ps_bitstrm->u4_cur_word,
             ps_bitstrm->u4_nxt_word,
             u4_numbits);
    return u4_bits_read;

}